

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

bool __thiscall spdlog::logger::should_log(logger *this,level_enum msg_level)

{
  int in_ESI;
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(int *)(in_RDI + 0x40) <= in_ESI;
}

Assistant:

bool should_log(level::level_enum msg_level) const {
        return msg_level >= level_.load(std::memory_order_relaxed);
    }